

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

void __thiscall
Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
          (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,
          MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *factors)

{
  ulong uVar1;
  __mpz_struct _Stack_58;
  uint local_48 [2];
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_40;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_38;
  
  IntegerConstantType::IntegerConstantType((IntegerConstantType *)&_Stack_58,1);
  local_38._factors._capacity = (factors->_factors)._capacity;
  (factors->_factors)._capacity = 0;
  local_38._factors._end = (factors->_factors)._end;
  (factors->_factors)._end = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  local_38._factors._stack = (factors->_factors)._stack;
  local_38._factors._cursor = (factors->_factors)._cursor;
  (factors->_factors)._cursor = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  (factors->_factors)._stack = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  ::Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)local_48,&local_38);
  IntegerConstantType::IntegerConstantType(&this->numeral,(IntegerConstantType *)&_Stack_58);
  (this->factors)._id = local_48[0];
  (this->factors)._ptr = local_40;
  if (local_38._factors._stack !=
      (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar1 = local_38._factors._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      *(undefined8 *)
       &((local_38._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38._factors._stack;
    }
    else if (uVar1 < 0x11) {
      *(undefined8 *)
       &((local_38._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_38._factors._stack;
    }
    else if (uVar1 < 0x19) {
      *(undefined8 *)
       &((local_38._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_38._factors._stack;
    }
    else if (uVar1 < 0x21) {
      *(undefined8 *)
       &((local_38._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_38._factors._stack;
    }
    else if (uVar1 < 0x31) {
      *(undefined8 *)
       &((local_38._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_38._factors._stack;
    }
    else if (uVar1 < 0x41) {
      *(undefined8 *)
       &((local_38._factors._stack)->term).super_PolyNfSuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_38._factors._stack;
    }
    else {
      operator_delete(local_38._factors._stack,0x10);
    }
  }
  mpz_clear(&_Stack_58);
  return;
}

Assistant:

Monom(MonomFactors<Number> factors) : Monom(Numeral(1), perfect(std::move(factors))) {}